

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool __thiscall ClipperLib::Orientation(ClipperLib *this,OutRec *outRec,bool UseFullInt64Range)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  Int128 local_88;
  long local_78;
  long local_70;
  Int128 local_68;
  Int128 local_58;
  long local_48;
  long local_40;
  Int128 local_38;
  Int128 local_28;
  
  puVar4 = *(undefined4 **)(this + 0x18);
  if (puVar4 == (undefined4 *)0x0) {
    return false;
  }
  puVar3 = puVar4;
  puVar1 = puVar4;
  while (puVar2 = puVar1, puVar3 = *(undefined4 **)(puVar3 + 6), puVar3 != puVar4) {
    puVar1 = puVar2;
    if (((*(long *)(puVar2 + 4) <= *(long *)(puVar3 + 4)) &&
        (puVar1 = puVar3, *(long *)(puVar3 + 4) <= *(long *)(puVar2 + 4))) &&
       (puVar1 = puVar2, *(long *)(puVar3 + 2) < *(long *)(puVar2 + 2))) {
      puVar1 = puVar3;
    }
  }
  *(undefined4 **)(this + 0x20) = puVar2;
  *puVar2 = *(undefined4 *)this;
  puVar4 = *(undefined4 **)(puVar2 + 6);
  local_38.lo = *(long64 *)(puVar2 + 2);
  lVar5 = *(long *)(puVar2 + 4);
  puVar3 = puVar2;
  do {
    puVar3 = *(undefined4 **)(puVar3 + 8);
    if ((puVar2 == puVar3) || (local_38.lo != *(long *)(puVar3 + 2))) break;
  } while (lVar5 == *(long *)(puVar3 + 4));
  do {
    if (puVar2 == puVar4) {
      local_40 = *(long *)(puVar4 + 4);
LAB_005831ee:
      lVar6 = *(long *)(puVar4 + 2) - local_38.lo;
      local_38.lo = local_38.lo - *(long *)(puVar3 + 2);
      local_40 = local_40 - lVar5;
      lVar5 = lVar5 - *(long *)(puVar3 + 4);
      if ((char)outRec == '\0') {
        bVar7 = lVar6 * lVar5 <= local_40 * local_38.lo;
      }
      else {
        local_38.hi = local_38.lo >> 0x3f;
        local_48 = local_40 >> 0x3f;
        Int128::operator*(&local_28,&local_38);
        local_68.hi = lVar6 >> 0x3f;
        local_78 = lVar5 >> 0x3f;
        local_70 = lVar5;
        local_68.lo = lVar6;
        Int128::operator*(&local_58,&local_68);
        Int128::operator-(&local_88,&local_28);
        if (local_88.hi == 0) {
          local_88.hi = local_88.lo;
        }
        bVar7 = -1 < local_88.hi;
      }
      return bVar7;
    }
    local_40 = *(long *)(puVar4 + 4);
    if ((*(long *)(puVar4 + 2) != local_38.lo) || (lVar5 != local_40)) goto LAB_005831ee;
    puVar4 = *(undefined4 **)(puVar4 + 6);
  } while( true );
}

Assistant:

bool Orientation(OutRec *outRec, bool UseFullInt64Range)
{
  if (!outRec->pts)
    return 0.0;

  //first make sure bottomPt is correctly assigned ...
  OutPt *opBottom = outRec->pts, *op = outRec->pts->next;
  while (op != outRec->pts)
  {
    if (op->pt.Y >= opBottom->pt.Y)
    {
      if (op->pt.Y > opBottom->pt.Y || op->pt.X < opBottom->pt.X)
      opBottom = op;
    }
    op = op->next;
  }
  outRec->bottomPt = opBottom;
  opBottom->idx = outRec->idx;

  op = opBottom;
  //find vertices either side of bottomPt (skipping duplicate points) ....
  OutPt *opPrev = op->prev;
  OutPt *opNext = op->next;
  while (op != opPrev && PointsEqual(op->pt, opPrev->pt))
    opPrev = opPrev->prev;
  while (op != opNext && PointsEqual(op->pt, opNext->pt))
    opNext = opNext->next;

  IntPoint ip1, ip2;
  ip1.X = op->pt.X - opPrev->pt.X;
  ip1.Y = op->pt.Y - opPrev->pt.Y;
  ip2.X = opNext->pt.X - op->pt.X;
  ip2.Y = opNext->pt.Y - op->pt.Y;

  if (UseFullInt64Range)
    return Int128(ip1.X) * Int128(ip2.Y) - Int128(ip2.X) * Int128(ip1.Y) >= 0;
  else
    return (ip1.X * ip2.Y - ip2.X * ip1.Y) >= 0;
}